

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::PatchGetRootValue<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *requestContext;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  Var value;
  
  if ((((object->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1f9a,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_88 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_88,functionBody,inlineCache,inlineCacheIndex,true);
  bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,false,false>
                    (object,true,&object->super_RecyclableObject,propertyId,
                     (Var *)&info.inlineCacheIndex,requestContext,(PropertyCacheOperationInfo *)0x0,
                     (PropertyValueInfo *)local_88);
  if (!bVar2) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
    if ((bVar2) && (DAT_015bc46a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootValue",propertyId,requestContext,
                 &object->super_RecyclableObject);
    }
    info._56_8_ = OP_GetRootProperty(object,propertyId,(PropertyValueInfo *)local_88,requestContext)
    ;
  }
  return (Var)info._56_8_;
}

Assistant:

inline Var JavascriptOperators::PatchGetRootValue(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject * object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootValue);
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootValue"), propertyId, scriptContext, object);
        }
#endif

        return JavascriptOperators::OP_GetRootProperty(object, propertyId, &info, scriptContext);
        JIT_HELPER_END(Op_PatchGetRootValue);
    }